

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaBalAig.c
# Opt level: O3

void Gia_ManBalance_rec(Gia_Man_t *pNew,Gia_Man_t *p,Gia_Obj_t *pObj)

{
  int iVar1;
  Bal_Man_t *p_00;
  int *piVar2;
  ulong uVar3;
  uint uVar4;
  Vec_Int_t *pVVar5;
  uint *puVar6;
  Vec_Int_t *pVVar7;
  int *piVar8;
  int t;
  uint uVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  long lVar13;
  Gia_Obj_t *pGVar14;
  ulong uVar15;
  int iVar16;
  uint uVar17;
  uint uVar18;
  ulong uVar19;
  int *piVar20;
  uint uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  bool bVar25;
  int local_6c;
  uint local_68;
  uint local_64;
  
  if (pObj->Value != 0xffffffff) {
    return;
  }
  if (((int)(uint)*(undefined8 *)pObj < 0) ||
     (uVar4 = (uint)*(undefined8 *)pObj & 0x1fffffff, uVar4 == 0x1fffffff)) {
    __assert_fail("Gia_ObjIsAnd(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaBalLut.c"
                  ,0x370,"void Gia_ManBalance_rec(Gia_Man_t *, Gia_Man_t *, Gia_Obj_t *)");
  }
  pGVar14 = p->pObjs;
  if ((pObj < pGVar14) || (pGVar14 + p->nObjs <= pObj)) {
LAB_0070b617:
    __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
  }
  puVar6 = p->pMuxes;
  if ((puVar6 != (uint *)0x0) &&
     (puVar6[(int)((ulong)((long)pObj - (long)pGVar14) >> 2) * -0x55555555] != 0)) {
    Gia_ManBalance_rec(pNew,p,pObj + -(ulong)uVar4);
    Gia_ManBalance_rec(pNew,p,pObj + -(ulong)(*(uint *)&pObj->field_0x4 & 0x1fffffff));
    uVar4 = 0;
    if (p->pMuxes == (uint *)0x0) {
      pGVar14 = (Gia_Obj_t *)0x0;
    }
    else {
      pGVar14 = p->pObjs;
      if ((pObj < pGVar14) || (pGVar14 + p->nObjs <= pObj)) goto LAB_0070b617;
      uVar10 = p->pMuxes[(int)((ulong)((long)pObj - (long)pGVar14) >> 2) * -0x55555555];
      if ((int)uVar10 < 0) goto LAB_0070b57c;
      uVar10 = uVar10 >> 1;
      if (p->nObjs <= (int)uVar10) goto LAB_0070b5d9;
      pGVar14 = pGVar14 + uVar10;
    }
    Gia_ManBalance_rec(pNew,p,pGVar14);
    if (p->pMuxes == (uint *)0x0) {
      puVar6 = (uint *)&DAT_00000008;
    }
    else {
      pGVar14 = p->pObjs;
      if ((pObj < pGVar14) || (pGVar14 + p->nObjs <= pObj)) goto LAB_0070b617;
      uVar4 = p->pMuxes[(int)((ulong)((long)pObj - (long)pGVar14) >> 2) * -0x55555555];
      if ((int)uVar4 < 0) {
LAB_0070b57c:
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                      ,0x12f,"int Abc_Lit2Var(int)");
      }
      if (p->nObjs <= (int)(uVar4 >> 1)) {
LAB_0070b5d9:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      puVar6 = &pGVar14[uVar4 >> 1].Value;
      uVar4 = uVar4 & 1;
    }
    if (-1 < (int)*puVar6) {
      uVar10 = (uint)((ulong)*(undefined8 *)pObj >> 0x20);
      if (-1 < (int)pObj[-(ulong)(uVar10 & 0x1fffffff)].Value) {
        uVar18 = (uint)*(undefined8 *)pObj;
        if (-1 < (int)pObj[-(ulong)(uVar18 & 0x1fffffff)].Value) {
          uVar4 = *puVar6 ^ uVar4;
          pGVar14 = (Gia_Obj_t *)(ulong)uVar4;
          uVar4 = Gia_ManHashMuxReal(pNew,uVar4,
                                     uVar10 >> 0x1d & 1 ^ pObj[-(ulong)(uVar10 & 0x1fffffff)].Value,
                                     pObj[-(ulong)(uVar18 & 0x1fffffff)].Value ^ uVar18 >> 0x1d & 1)
          ;
          pObj->Value = uVar4;
          Bal_ManSetGateLevel((Bal_Man_t *)pNew->pData,pGVar14,uVar4);
          return;
        }
      }
    }
LAB_0070b5ba:
    __assert_fail("Lit >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                  ,0x132,"int Abc_LitNotCond(int, int)");
  }
  if (p->vSuper == (Vec_Int_t *)0x0) {
    pVVar5 = (Vec_Int_t *)malloc(0x10);
    pVVar5->nCap = 1000;
    pVVar5->nSize = 0;
    piVar8 = (int *)malloc(4000);
    pVVar5->pArray = piVar8;
    p->vSuper = pVVar5;
  }
  else {
    p->vSuper->nSize = 0;
  }
  uVar22 = *(ulong *)pObj;
  uVar4 = (uint)uVar22;
  if (((int)uVar4 < 0) || (uVar10 = uVar4 & 0x1fffffff, uVar10 == 0x1fffffff)) {
LAB_0070b674:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaBalLut.c"
                  ,0x30f,"void Gia_ManSuperCollect(Gia_Man_t *, Gia_Obj_t *)");
  }
  uVar18 = (uint)(uVar22 >> 0x20) & 0x1fffffff;
  if ((uVar4 & 0x1fffffff) < uVar18) {
    if ((uVar22 & 0x2000000020000000) != 0) {
      __assert_fail("!Gia_ObjFaninC0(pObj) && !Gia_ObjFaninC1(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaBalLut.c"
                    ,0x2fc,"void Gia_ManSuperCollect(Gia_Man_t *, Gia_Obj_t *)");
    }
    Gia_ManSuperCollectXor_rec(p,pObj + -(ulong)uVar10);
    Gia_ManSuperCollectXor_rec(p,pObj + -(ulong)(*(uint *)&pObj->field_0x4 & 0x1fffffff));
    qsort(p->vSuper->pArray,(long)p->vSuper->nSize,4,Vec_IntSortCompare1);
    pVVar5 = p->vSuper;
    uVar10 = pVVar5->nSize;
    if ((int)uVar10 < 1) {
      if ((int)uVar10 < 0) goto LAB_0070b655;
      pVVar5->nSize = 0;
      uVar4 = 0;
      goto LAB_0070ac66;
    }
    puVar6 = (uint *)pVVar5->pArray;
    uVar18 = 0xffffffff;
    lVar13 = 0;
    uVar4 = 0;
    uVar21 = 0;
    do {
      uVar9 = puVar6[lVar13];
      if (uVar9 != 0) {
        if (uVar9 == 1) {
          uVar4 = uVar4 ^ 1;
        }
        else if (uVar18 == uVar9) {
          uVar21 = uVar21 - 1;
          uVar18 = 0xffffffff;
        }
        else {
          if (((int)uVar21 < 0) || (uVar10 <= uVar21)) goto LAB_0070b59b;
          uVar22 = (ulong)uVar21;
          uVar21 = uVar21 + 1;
          puVar6[uVar22] = uVar9;
          uVar10 = pVVar5->nSize;
          uVar18 = uVar9;
        }
      }
      lVar13 = lVar13 + 1;
    } while (lVar13 < (int)uVar10);
    if ((int)uVar10 < (int)uVar21) goto LAB_0070b655;
    pVVar5->nSize = uVar21;
    if (uVar21 == 0) goto LAB_0070ac66;
    if (uVar4 != 0) {
      if ((int)uVar21 < 1) {
LAB_0070b55d:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      if ((int)*puVar6 < 0) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                      ,0x131,"int Abc_LitNot(int)");
      }
      *puVar6 = *puVar6 ^ 1;
    }
  }
  else {
    if (((uVar4 & 0x1fffffff) <= uVar18) ||
       ((puVar6 != (uint *)0x0 &&
        (puVar6[(int)((ulong)((long)pObj - (long)pGVar14) >> 2) * -0x55555555] != 0))))
    goto LAB_0070b674;
    Gia_ManSuperCollectAnd_rec
              (p,(Gia_Obj_t *)((ulong)(uVar4 >> 0x1d & 1) ^ (ulong)(pObj + -(ulong)uVar10)));
    uVar4 = (uint)((ulong)*(undefined8 *)pObj >> 0x20);
    Gia_ManSuperCollectAnd_rec
              (p,(Gia_Obj_t *)
                 ((ulong)(uVar4 >> 0x1d & 1) ^ (ulong)(pObj + -(ulong)(uVar4 & 0x1fffffff))));
    qsort(p->vSuper->pArray,(long)p->vSuper->nSize,4,Vec_IntSortCompare1);
    pVVar5 = p->vSuper;
    uVar4 = pVVar5->nSize;
    if ((int)uVar4 < 1) {
      if ((int)uVar4 < 0) goto LAB_0070b655;
      pVVar5->nSize = 0;
    }
    else {
      piVar8 = pVVar5->pArray;
      lVar13 = 0;
      uVar10 = 0xffffffff;
      uVar18 = 0;
      do {
        uVar21 = piVar8[lVar13];
        if (uVar21 != 1) {
          if (uVar21 == 0) {
LAB_0070b512:
            if (pVVar5->nCap < 1) {
              piVar8 = (int *)realloc(piVar8,4);
              pVVar5->pArray = piVar8;
              if (piVar8 == (int *)0x0) {
                __assert_fail("p->pArray",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                              ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
              }
              pVVar5->nCap = 1;
            }
            *piVar8 = 0;
            pVVar5->nSize = 1;
            goto LAB_0070ac6b;
          }
          if (uVar10 != 0xffffffff) {
            if (((int)uVar10 < 0) || ((int)uVar21 < 0)) goto LAB_0070b57c;
            if ((uVar21 ^ uVar10) < 2) {
              if (uVar10 == uVar21) goto LAB_0070ab15;
              goto LAB_0070b512;
            }
          }
          if (((int)uVar18 < 0) || (uVar4 <= uVar18)) goto LAB_0070b59b;
          uVar22 = (ulong)uVar18;
          uVar18 = uVar18 + 1;
          piVar8[uVar22] = uVar21;
          uVar4 = pVVar5->nSize;
          uVar10 = uVar21;
        }
LAB_0070ab15:
        lVar13 = lVar13 + 1;
      } while (lVar13 < (int)uVar4);
      if ((int)uVar4 < (int)uVar18) goto LAB_0070b655;
      pVVar5->nSize = uVar18;
      if (uVar18 != 0) goto LAB_0070ac6b;
    }
    uVar4 = 1;
LAB_0070ac66:
    Vec_IntPush(pVVar5,uVar4);
  }
LAB_0070ac6b:
  pVVar5 = p->vSuper;
  if (pVVar5->nSize < 1) {
    __assert_fail("Vec_IntSize(p->vSuper) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaBalLut.c"
                  ,0x312,"void Gia_ManSuperCollect(Gia_Man_t *, Gia_Obj_t *)");
  }
  pVVar7 = p->vStore;
  if (pVVar7 == (Vec_Int_t *)0x0) {
    pVVar7 = (Vec_Int_t *)malloc(0x10);
    pVVar7->nCap = 1000;
    pVVar7->nSize = 0;
    piVar8 = (int *)malloc(4000);
    pVVar7->pArray = piVar8;
    p->vStore = pVVar7;
    if (pVVar5->nSize < 1) goto LAB_0070b636;
    local_64 = 0;
  }
  else {
    local_64 = pVVar7->nSize;
  }
  lVar13 = 0;
  do {
    Vec_IntPush(pVVar7,pVVar5->pArray[lVar13]);
    lVar13 = lVar13 + 1;
  } while (lVar13 < pVVar5->nSize);
  pVVar5 = p->vStore;
  iVar11 = pVVar5->nSize;
  if (iVar11 <= (int)local_64) {
LAB_0070b636:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
  }
  uVar22 = (ulong)local_64;
  do {
    if (((int)local_64 < 0) || (pVVar5->nSize <= (int)uVar22)) goto LAB_0070b55d;
    uVar4 = pVVar5->pArray[uVar22];
    if ((int)uVar4 < 0) goto LAB_0070b57c;
    if (p->nObjs <= (int)(uVar4 >> 1)) goto LAB_0070b5d9;
    pGVar14 = p->pObjs;
    Gia_ManBalance_rec(pNew,p,pGVar14 + (uVar4 >> 1));
    uVar10 = pGVar14[uVar4 >> 1].Value;
    if ((int)uVar10 < 0) goto LAB_0070b5ba;
    pVVar5 = p->vStore;
    if (pVVar5->nSize <= (int)uVar22) goto LAB_0070b59b;
    pVVar5->pArray[uVar22] = uVar10 ^ uVar4 & 1;
    uVar22 = uVar22 + 1;
  } while ((int)uVar22 < iVar11);
  if (pVVar5->nSize != iVar11) {
    __assert_fail("Vec_IntSize(p->vStore) == iEnd",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaBalLut.c"
                  ,0x38b,"void Gia_ManBalance_rec(Gia_Man_t *, Gia_Man_t *, Gia_Obj_t *)");
  }
  uVar4 = iVar11 - local_64;
  if (uVar4 == 0 || iVar11 < (int)local_64) goto LAB_0070b636;
  pVVar7 = p->vSuper;
  piVar8 = pVVar5->pArray + local_64;
  pVVar7->nSize = 0;
  if (uVar4 == 2) {
    Vec_IntPush(pVVar7,*piVar8);
    Vec_IntPush(pVVar7,piVar8[1]);
    iVar11 = pVVar7->nSize;
    if (iVar11 < 1) {
LAB_0070b70f:
      __assert_fail("p->nSize > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x3bc,"int Vec_IntPop(Vec_Int_t *)");
    }
    uVar4 = iVar11 - 1;
    pVVar7->nSize = uVar4;
    if (uVar4 == 0) goto LAB_0070b70f;
    iVar16 = pVVar7->pArray[uVar4];
    pVVar7->nSize = iVar11 - 2U;
    iVar11 = pVVar7->pArray[iVar11 - 2U];
    uVar4 = (uint)*(undefined8 *)pObj;
    if (((~uVar4 & 0x1fffffff) == 0 || (int)uVar4 < 0) ||
       (((uint)((ulong)*(undefined8 *)pObj >> 0x20) & 0x1fffffff) <= (uVar4 & 0x1fffffff))) {
      uVar4 = Gia_ManHashAnd(pNew,iVar16,iVar11);
    }
    else if (pNew->pMuxes == (uint *)0x0) {
      uVar4 = Gia_ManHashXor(pNew,iVar16,iVar11);
    }
    else {
      uVar4 = Gia_ManHashXorReal(pNew,iVar16,iVar11);
    }
    pGVar14 = (Gia_Obj_t *)(ulong)uVar4;
    Vec_IntPush(pVVar7,uVar4);
    Bal_ManSetGateLevel((Bal_Man_t *)pNew->pData,pGVar14,uVar4);
    uVar4 = pVVar7->nSize;
    uVar22 = (ulong)(int)uVar4;
    if (1 < (long)uVar22) {
      do {
        if ((long)pVVar7->nSize < (long)uVar22) goto LAB_0070b55d;
        uVar4 = pVVar7->pArray[uVar22 - 1];
        if ((int)uVar4 < 0) goto LAB_0070b57c;
        uVar10 = pVVar7->pArray[uVar22 - 2];
        iVar11 = Gia_ObjLevelId((Gia_Man_t *)pNew->vLevels,uVar4 >> 1);
        if ((int)uVar10 < 0) goto LAB_0070b57c;
        iVar16 = Gia_ObjLevelId((Gia_Man_t *)pNew->vLevels,uVar10 >> 1);
        if (iVar11 <= iVar16) break;
        if ((long)pVVar7->nSize < (long)uVar22) {
LAB_0070b59b:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        piVar8 = pVVar7->pArray;
        piVar8[uVar22 - 1] = uVar10;
        if ((long)pVVar7->nSize <= (long)(uVar22 - 2)) goto LAB_0070b59b;
        piVar8[uVar22 - 2] = uVar4;
        bVar25 = 2 < uVar22;
        uVar22 = uVar22 - 1;
      } while (bVar25);
      goto LAB_0070adfe;
    }
  }
  else if (uVar4 == 1) {
    Vec_IntPush(pVVar7,*piVar8);
LAB_0070adfe:
    uVar4 = pVVar7->nSize;
  }
  else {
    if ((int)uVar4 < 3) goto LAB_0070b6b2;
    p_00 = (Bal_Man_t *)pNew->pData;
    uVar22 = 0;
    do {
      Vec_IntPush(pVVar7,piVar8[uVar22]);
      uVar22 = uVar22 + 1;
    } while (uVar4 != uVar22);
    uVar4 = pVVar7->nSize;
    if (1 < (long)(int)uVar4) {
      piVar8 = pVVar7->pArray;
      pVVar5 = p_00->vCosts;
      uVar15 = 1;
      uVar22 = 0;
      do {
        uVar23 = uVar22 + 1;
        uVar24 = uVar22 & 0xffffffff;
        uVar19 = uVar15;
        do {
          if (piVar8[uVar19] < 0) goto LAB_0070b57c;
          uVar18 = (uint)piVar8[uVar19] >> 1;
          uVar10 = pVVar5->nSize;
          if ((int)uVar10 <= (int)uVar18) goto LAB_0070b55d;
          if (piVar8[(int)uVar24] < 0) goto LAB_0070b57c;
          uVar21 = (uint)piVar8[(int)uVar24] >> 1;
          if (uVar10 <= uVar21) goto LAB_0070b55d;
          piVar20 = pVVar5->pArray;
          uVar3 = uVar19 & 0xffffffff;
          if (piVar20[uVar18] <= piVar20[uVar21]) {
            uVar3 = uVar24;
          }
          uVar24 = uVar3;
          uVar19 = uVar19 + 1;
        } while ((long)(int)uVar4 != uVar19);
        uVar10 = piVar8[uVar22];
        piVar20 = (int *)(ulong)uVar10;
        piVar8[uVar22] = piVar8[(int)uVar24];
        piVar8[(int)uVar24] = uVar10;
        uVar15 = uVar15 + 1;
        uVar22 = uVar23;
      } while (uVar23 != uVar4 - 1);
      uVar4 = pVVar7->nSize;
      if (1 < (int)uVar4) {
        do {
          uVar22 = (ulong)uVar4;
          if (piVar8[uVar22 - 1] < 0) goto LAB_0070b57c;
          uVar18 = (uint)piVar8[uVar22 - 1] >> 1;
          uVar10 = p_00->vCosts->nSize;
          if ((int)uVar10 <= (int)uVar18) goto LAB_0070b55d;
          piVar2 = p_00->vCosts->pArray;
          iVar11 = piVar2[uVar18] >> 4;
          uVar15 = uVar22;
          do {
            if ((long)uVar15 < 2) {
              local_6c = -1;
              local_68 = 0xffffffff;
              uVar15 = 0;
              goto LAB_0070b112;
            }
            if (piVar8[uVar15 - 2] < 0) goto LAB_0070b57c;
            uVar18 = (uint)piVar8[uVar15 - 2] >> 1;
            if (uVar10 <= uVar18) goto LAB_0070b55d;
            iVar16 = piVar2[uVar18] >> 4;
            if (iVar16 < iVar11) {
              __assert_fail("DelayCur >= Delay",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaBalLut.c"
                            ,0x24f,"int Vec_IntFindFirstSameDelayAsLast(Bal_Man_t *, Vec_Int_t *)");
            }
            uVar15 = uVar15 - 1;
          } while (iVar16 <= iVar11);
          if ((int)uVar4 <= (int)uVar15) {
            __assert_fail("iBeg <= iEnd",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaBalLut.c"
                          ,0x268,"int Bal_ManFindBestPair(Bal_Man_t *, Vec_Int_t *, Gia_Obj_t *)");
          }
          local_6c = -1;
          uVar10 = 1000000000;
          local_68 = 0xffffffff;
          uVar23 = uVar15 & 0xffffffff;
          do {
            uVar24 = uVar23 - 1;
            uVar19 = uVar22;
            do {
              uVar18 = Bal_ManEvalTwo(p_00,piVar8[uVar19 - 1],piVar8[uVar24],0,(int)piVar20);
              if (uVar18 != 0xffffffff) {
                if (piVar8[uVar24] < 0) goto LAB_0070b57c;
                uVar21 = (uint)piVar8[uVar24] >> 1;
                if (p_00->vCosts->nSize <= (int)uVar21) goto LAB_0070b55d;
                if (uVar18 == p_00->vCosts->pArray[uVar21]) {
                  local_68 = (int)uVar24 << 0x10 | (int)uVar19 - 1U;
                  goto LAB_0070b233;
                }
                if ((int)uVar18 < (int)uVar10) {
                  local_68 = (int)uVar19 - 1;
                  uVar10 = uVar18;
                  local_6c = (int)uVar24;
                }
              }
              uVar19 = uVar19 - 1;
            } while ((long)(uVar15 & 0xffffffff) < (long)uVar19);
            bVar25 = 1 < (long)uVar23;
            uVar23 = uVar24;
          } while (bVar25);
          if (uVar10 == 1000000000) {
LAB_0070b112:
            uVar10 = (int)uVar15 * 0x10000;
            iVar11 = 1000000000;
            uVar15 = (long)(int)uVar15;
            do {
              uVar10 = uVar10 + 0x10000;
              uVar23 = uVar15 + 1;
              uVar18 = uVar10;
              for (uVar19 = uVar23; (long)uVar19 < (long)uVar22; uVar19 = uVar19 + 1) {
                iVar16 = Bal_ManEvalTwo(p_00,piVar8[uVar15],piVar8[uVar19],0,(int)piVar20);
                if (iVar16 != -1) {
                  if (piVar8[uVar15] < 0) goto LAB_0070b57c;
                  uVar9 = (uint)piVar8[uVar15] >> 1;
                  uVar21 = p_00->vCosts->nSize;
                  if ((int)uVar21 <= (int)uVar9) goto LAB_0070b55d;
                  if (piVar8[uVar19] < 0) goto LAB_0070b57c;
                  uVar17 = (uint)piVar8[uVar19] >> 1;
                  if (uVar21 <= uVar17) goto LAB_0070b55d;
                  piVar2 = p_00->vCosts->pArray;
                  iVar1 = piVar2[uVar9];
                  iVar12 = piVar2[uVar17];
                  if (iVar12 < iVar1) {
                    iVar12 = iVar1;
                  }
                  if (iVar16 == iVar12) {
                    local_68 = uVar18 | (uint)uVar15;
                    goto LAB_0070b233;
                  }
                  if (iVar16 < iVar11) {
                    local_6c = (int)uVar19;
                    iVar11 = iVar16;
                    local_68 = (uint)uVar15;
                  }
                }
                uVar18 = uVar18 + 0x10000;
              }
              uVar15 = uVar23;
            } while (uVar23 != uVar22);
            if (iVar11 == 1000000000) {
              local_68 = uVar4 - 2 | uVar4 * 0x10000 - 0x10000;
            }
            else {
              local_68 = local_6c << 0x10 | local_68;
            }
          }
          else {
            if (piVar8[local_6c] < 0) goto LAB_0070b57c;
            uVar18 = (uint)piVar8[local_6c] >> 1;
            if (p_00->vCosts->nSize <= (int)uVar18) goto LAB_0070b55d;
            if (0xf < (uVar10 ^ p_00->vCosts->pArray[uVar18])) goto LAB_0070b112;
            local_68 = local_6c << 0x10 | local_68;
          }
LAB_0070b233:
          uVar4 = (int)local_68 >> 0x10;
          if ((int)uVar4 < 0) goto LAB_0070b55d;
          uVar10 = pVVar7->nSize;
          uVar22 = (ulong)uVar10;
          if (((int)uVar10 <= (int)uVar4) || (uVar10 <= (local_68 & 0xffff))) goto LAB_0070b55d;
          piVar8 = pVVar7->pArray;
          uVar4 = piVar8[uVar4];
          pGVar14 = (Gia_Obj_t *)(ulong)uVar4;
          iVar11 = piVar8[local_68 & 0xffff];
          uVar15 = 1;
LAB_0070b273:
          if (piVar8[uVar15 - 1] != uVar4) goto code_r0x0070b27a;
          if ((int)uVar15 < (int)uVar10) {
            do {
              piVar8[uVar15 - 1] = piVar8[uVar15];
              uVar15 = uVar15 + 1;
              uVar10 = pVVar7->nSize;
            } while ((int)uVar15 < (int)uVar10);
          }
          uVar22 = (ulong)(uVar10 - 1);
          pVVar7->nSize = uVar10 - 1;
LAB_0070b2ac:
          iVar16 = (int)uVar22;
          if (0 < iVar16) {
            uVar15 = 1;
LAB_0070b2bc:
            if (piVar8[uVar15 - 1] != iVar11) goto code_r0x0070b2c3;
            if ((int)uVar15 < iVar16) {
              do {
                piVar8[uVar15 - 1] = piVar8[uVar15];
                uVar15 = uVar15 + 1;
                iVar16 = pVVar7->nSize;
              } while ((int)uVar15 < iVar16);
            }
            pVVar7->nSize = iVar16 + -1;
            goto LAB_0070b2fc;
          }
          if (iVar16 != 0) {
            __assert_fail("i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,999,"int Vec_IntRemove(Vec_Int_t *, int)");
          }
LAB_0070b2fc:
          uVar10 = (uint)*(undefined8 *)pObj;
          if (((~uVar10 & 0x1fffffff) == 0 || (int)uVar10 < 0) ||
             (((uint)((ulong)*(undefined8 *)pObj >> 0x20) & 0x1fffffff) <= (uVar10 & 0x1fffffff))) {
            iVar11 = Gia_ManHashAnd(pNew,uVar4,iVar11);
          }
          else {
            iVar11 = Gia_ManHashXorReal(pNew,uVar4,iVar11);
          }
          Bal_ManSetGateLevel(p_00,pGVar14,iVar11);
          pVVar5 = p_00->vCosts;
          Vec_IntPush(pVVar7,iVar11);
          uVar4 = pVVar7->nSize;
          if ((int)uVar4 < 2) break;
          piVar8 = pVVar7->pArray;
          do {
            uVar18 = uVar4 - 1;
            uVar10 = piVar8[uVar18];
            if ((int)uVar10 < 0) goto LAB_0070b57c;
            uVar21 = pVVar5->nSize;
            if ((int)uVar21 <= (int)(uVar10 >> 1)) goto LAB_0070b55d;
            uVar9 = piVar8[(ulong)uVar4 - 2];
            if ((int)uVar9 < 0) goto LAB_0070b57c;
            if (uVar21 <= uVar9 >> 1) goto LAB_0070b55d;
            piVar20 = pVVar5->pArray;
            if (piVar20[uVar10 >> 1] <= piVar20[uVar9 >> 1]) break;
            piVar8[uVar18] = uVar9;
            piVar8[(ulong)uVar4 - 2] = uVar10;
            bVar25 = 2 < uVar4;
            uVar4 = uVar18;
          } while (bVar25);
          uVar4 = pVVar7->nSize;
          if ((int)uVar4 < 2) break;
        } while( true );
      }
    }
  }
  if (uVar4 == 1) {
    pObj->Value = *pVVar7->pArray;
    if ((int)local_64 <= p->vStore->nSize) {
      p->vStore->nSize = local_64;
      return;
    }
LAB_0070b655:
    __assert_fail("p->nSize >= nSizeNew",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x2b7,"void Vec_IntShrink(Vec_Int_t *, int)");
  }
LAB_0070b6b2:
  __assert_fail("Vec_IntSize(vSuper) == 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaBalLut.c"
                ,0x35c,"int Gia_ManBalanceGate(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *, int *, int)");
code_r0x0070b27a:
  bVar25 = uVar15 == uVar22;
  uVar15 = uVar15 + 1;
  if (bVar25) goto LAB_0070b2ac;
  goto LAB_0070b273;
code_r0x0070b2c3:
  bVar25 = uVar15 == uVar22;
  uVar15 = uVar15 + 1;
  if (bVar25) goto LAB_0070b2fc;
  goto LAB_0070b2bc;
}

Assistant:

void Gia_ManBalance_rec( Gia_Man_t * pNew, Gia_Man_t * p, Gia_Obj_t * pObj, int fStrict )
{
    int i, iLit, iBeg, iEnd;
    if ( ~pObj->Value )
        return;
    assert( Gia_ObjIsAnd(pObj) );
    assert( !Gia_ObjIsBuf(pObj) );
    // handle MUX
    if ( Gia_ObjIsMux(p, pObj) )
    {
        Gia_ManBalance_rec( pNew, p, Gia_ObjFanin0(pObj), fStrict );
        Gia_ManBalance_rec( pNew, p, Gia_ObjFanin1(pObj), fStrict );
        Gia_ManBalance_rec( pNew, p, Gia_ObjFanin2(p, pObj), fStrict );
        pObj->Value = Gia_ManHashMuxReal( pNew, Gia_ObjFanin2Copy(p, pObj), Gia_ObjFanin1Copy(pObj), Gia_ObjFanin0Copy(pObj) );
        Gia_ObjSetGateLevel( pNew, Gia_ManObj(pNew, Abc_Lit2Var(pObj->Value)) );
        return;
    }
    // find supergate
    Gia_ManSuperCollect( p, pObj, fStrict );
    // save entries
    if ( p->vStore == NULL )
        p->vStore = Vec_IntAlloc( 1000 );
    iBeg = Vec_IntSize( p->vStore );
    Vec_IntAppend( p->vStore, p->vSuper );
    iEnd = Vec_IntSize( p->vStore );
    // call recursively
    Vec_IntForEachEntryStartStop( p->vStore, iLit, i, iBeg, iEnd )
    {
        Gia_Obj_t * pTemp = Gia_ManObj( p, Abc_Lit2Var(iLit) );
        Gia_ManBalance_rec( pNew, p, pTemp, fStrict );
        Vec_IntWriteEntry( p->vStore, i, Abc_LitNotCond(pTemp->Value, Abc_LitIsCompl(iLit)) );
    }
    assert( Vec_IntSize(p->vStore) == iEnd );
    // consider general case
    pObj->Value = Gia_ManBalanceGate( pNew, pObj, p->vSuper, Vec_IntEntryP(p->vStore, iBeg), iEnd-iBeg );
    Vec_IntShrink( p->vStore, iBeg );
}